

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<double> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pIVar15 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar16 = pGVar7->Count;
  lVar17 = (long)(((pGVar7->Offset + prim + 1) % iVar16 + iVar16) % iVar16) * (long)pGVar7->Stride;
  dVar1 = *(double *)((long)pGVar7->Xs + lVar17);
  dVar18 = log10(*(double *)((long)pGVar7->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar16 = pTVar8->YAxis;
  pIVar9 = pIVar15->CurrentPlot;
  dVar2 = pIVar9->YAxis[iVar16].Range.Min;
  IVar3 = pIVar15->PixelRange[iVar16].Min;
  IVar19.x = (float)(pIVar15->Mx * (dVar1 - (pIVar9->XAxis).Range.Min) + (double)IVar3.x);
  IVar19.y = (float)(pIVar15->My[iVar16] *
                     (((double)(float)(dVar18 / pIVar15->LogDenY[iVar16]) *
                       (pIVar9->YAxis[iVar16].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y
                    );
  fVar20 = (this->P1).x;
  fVar21 = (this->P1).y;
  auVar25._0_4_ = ~-(uint)(IVar19.x <= fVar20) & (uint)IVar19.x;
  auVar25._4_4_ = ~-(uint)(IVar19.y <= fVar21) & (uint)IVar19.y;
  auVar25._8_4_ = ~-(uint)(fVar20 < IVar19.x) & (uint)IVar19.x;
  auVar25._12_4_ = ~-(uint)(fVar21 < IVar19.y) & (uint)IVar19.y;
  auVar13._4_4_ = (uint)fVar21 & -(uint)(IVar19.y <= fVar21);
  auVar13._0_4_ = (uint)fVar20 & -(uint)(IVar19.x <= fVar20);
  auVar13._8_4_ = (uint)fVar20 & -(uint)(fVar20 < IVar19.x);
  auVar13._12_4_ = (uint)fVar21 & -(uint)(fVar21 < IVar19.y);
  auVar25 = auVar25 | auVar13;
  fVar22 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar25._8_8_;
  auVar14._0_4_ = -(uint)(auVar25._4_4_ < fVar22);
  auVar26._0_8_ = auVar14._0_8_ << 0x20;
  auVar26._8_4_ = -(uint)(auVar25._8_4_ < (cull_rect->Max).x);
  auVar26._12_4_ = -(uint)(auVar25._12_4_ < (cull_rect->Max).y);
  auVar27._4_4_ = -(uint)(fVar22 < auVar25._4_4_);
  auVar27._0_4_ = -(uint)((cull_rect->Min).x < auVar25._0_4_);
  auVar27._8_8_ = auVar26._8_8_;
  iVar16 = movmskps((int)pIVar9,auVar27);
  if (iVar16 == 0xf) {
    IVar5 = this->Col;
    IVar3 = *uv;
    fVar22 = IVar19.x - fVar20;
    fVar23 = IVar19.y - fVar21;
    fVar24 = fVar22 * fVar22 + fVar23 * fVar23;
    if (0.0 < fVar24) {
      fVar24 = 1.0 / SQRT(fVar24);
      fVar22 = fVar22 * fVar24;
      fVar23 = fVar23 * fVar24;
    }
    fVar24 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar5;
    fVar22 = fVar24 * fVar22;
    fVar24 = fVar24 * fVar23;
    (pIVar10->pos).x = fVar20 + fVar24;
    (pIVar10->pos).y = fVar21 - fVar22;
    pIVar11[1].pos.x = fVar24 + IVar19.x;
    pIVar11[1].pos.y = IVar19.y - fVar22;
    pIVar11[1].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = IVar19.x - fVar24;
    pIVar10[2].pos.y = fVar22 + IVar19.y;
    pIVar10[2].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    IVar4 = this->P1;
    pIVar10[3].pos.x = IVar4.x - fVar24;
    pIVar10[3].pos.y = IVar4.y + fVar22;
    pIVar10[3].uv.x = IVar3.x;
    pIVar10[3].uv.y = IVar3.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = uVar6;
    puVar12[1] = uVar6 + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar12[3] = uVar6;
    puVar12[4] = uVar6 + 2;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar19;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }